

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMGBndry.cpp
# Opt level: O1

void amrex::MLMGBndry::setBoxBC
               (RealTuple *bloc,BCTuple *bctag,Box *bx,Box *domain,Array<LinOpBCType,_3> *lo,
               Array<LinOpBCType,_3> *hi,Real *dx,int ratio,RealVect *interior_bloc,
               Array<Real,_3> *domain_bloc_lo,Array<Real,_3> *domain_bloc_hi,
               GpuArray<int,_3U> *is_periodic)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  Array<LinOpBCType,_3> *pAVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  double dVar10;
  
  lVar9 = 0;
  uVar4 = 0;
  do {
    uVar3 = uVar4 / 3;
    lVar5 = (long)domain + uVar3 * -0xc;
    lVar7 = (long)bx + uVar3 * -0xc;
    lVar2 = lVar5 + 0xc;
    if (uVar4 < 3) {
      lVar2 = lVar5;
    }
    lVar5 = lVar7 + 0xc;
    if (uVar4 < 3) {
      lVar5 = lVar7;
    }
    if ((*(int *)(lVar2 + lVar9) == *(int *)(lVar5 + lVar9)) &&
       (*(int *)((long)is_periodic[-uVar3].arr + lVar9) == 0)) {
      pdVar8 = domain_bloc_hi->_M_elems;
      if (uVar4 < 3) {
        pdVar8 = domain_bloc_lo->_M_elems;
      }
      *(double *)((long)bloc->_M_elems + lVar9 * 2) =
           ((Array<Real,_3> *)((long)pdVar8 + -uVar3 * 0x18))->_M_elems[0];
      pAVar6 = hi + -uVar3;
      if (uVar4 < 3) {
        pAVar6 = lo + -uVar3;
      }
      iVar1 = *(int *)((long)pAVar6->_M_elems + lVar9);
      if (iVar1 == 0x67) {
        *(undefined4 *)((long)&bctag->_M_elems[0].bctype + lVar9) = 0x67;
      }
      else if (iVar1 == 0x66) {
        *(undefined4 *)((long)&bctag->_M_elems[0].bctype + lVar9) = 0x66;
      }
      else if (iVar1 == 0x65) {
        *(undefined4 *)((long)&bctag->_M_elems[0].bctype + lVar9) = 0x65;
      }
      else {
        Abort_host("MLMGBndry::setBoxBC: Unknown LinOpBCType");
      }
    }
    else {
      *(undefined4 *)((long)&bctag->_M_elems[0].bctype + lVar9) = 0x65;
      if (ratio < 1) {
        dVar10 = *(double *)((long)interior_bloc[-uVar3].vect + lVar9 * 2);
      }
      else {
        dVar10 = *(double *)((long)dx + lVar9 * 2 + uVar3 * -0x18) * (double)ratio * 0.5;
      }
      *(double *)((long)bloc->_M_elems + lVar9 * 2) = dVar10;
    }
    uVar4 = uVar4 + 1;
    lVar9 = lVar9 + 4;
    domain_bloc_lo = (Array<Real,_3> *)((long)domain_bloc_lo + 8);
    domain_bloc_hi = (Array<Real,_3> *)((long)domain_bloc_hi + 8);
  } while (lVar9 != 0x18);
  return;
}

Assistant:

void
MLMGBndry::setBoxBC (RealTuple& bloc, BCTuple& bctag, const Box& bx, const Box& domain,
                     const Array<LinOpBCType,AMREX_SPACEDIM>& lo,
                     const Array<LinOpBCType,AMREX_SPACEDIM>& hi,
                     const Real* dx, int ratio,
                     const RealVect& interior_bloc,
                     const Array<Real,AMREX_SPACEDIM>& domain_bloc_lo,
                     const Array<Real,AMREX_SPACEDIM>& domain_bloc_hi,
                     const GpuArray<int,AMREX_SPACEDIM>& is_periodic)
{
    for (OrientationIter fi; fi; ++fi)
    {
        const Orientation face = fi();
        const int         dir  = face.coordDir();

        if (domain[face] == bx[face] && !is_periodic[dir])
        {
            // All physical bc values are located on face.
            bloc[face] = face.isLow() ? domain_bloc_lo[dir] : domain_bloc_hi[dir];
            const auto linop_bc  = face.isLow() ? lo[dir] : hi[dir];
            if (linop_bc == LinOpBCType::Dirichlet) {
                bctag[face] = AMREX_LO_DIRICHLET;
            } else if (linop_bc == LinOpBCType::Neumann) {
                bctag[face] = AMREX_LO_NEUMANN;
            } else if (linop_bc == LinOpBCType::reflect_odd) {
                bctag[face] = AMREX_LO_REFLECT_ODD;
            } else {
                amrex::Abort("MLMGBndry::setBoxBC: Unknown LinOpBCType");
            }
        }
        else
        {
            // Internal bndry.
            bctag[face] = AMREX_LO_DIRICHLET;
            bloc[face]  = ratio > 0 ? Real(0.5)*ratio*dx[dir] : interior_bloc[dir];
            // If this is next to another same level box, bloc is
            // wrong.  But it doesn't matter, because we also have
            // mask.  It is used only if mask says it is next to
            // coarse cells.
        }
    }
}